

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::preprocessChildren(TraverseSchema *this,DOMElement *root)

{
  bool bVar1;
  int iVar2;
  DOMNode *node;
  undefined4 extraout_var;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_40;
  XMLCh *str1;
  
  NamespaceScopeManager::NamespaceScopeManager(&local_40,root,this->fSchemaInfo,this);
  for (node = &XUtil::getFirstChildElement(&root->super_DOMNode)->super_DOMNode;
      node != (DOMNode *)0x0; node = &XUtil::getNextSiblingElement(node)->super_DOMNode) {
    iVar2 = (*node->_vptr_DOMNode[0x18])(node);
    str1 = (XMLCh *)CONCAT44(extraout_var,iVar2);
    bVar1 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
    if (!bVar1) {
      bVar1 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgELT_INCLUDE);
      if (bVar1) {
        preprocessInclude(this,(DOMElement *)node);
      }
      else {
        bVar1 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgELT_IMPORT);
        if (bVar1) {
          preprocessImport(this,(DOMElement *)node);
        }
        else {
          bVar1 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgELT_REDEFINE);
          if (!bVar1) break;
          preprocessRedefine(this,(DOMElement *)node);
        }
      }
    }
  }
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return;
}

Assistant:

void TraverseSchema::preprocessChildren(const DOMElement* const root) {

    NamespaceScopeManager nsMgr(root, fSchemaInfo, this);

    // process <redefine>, <include> and <import> info items.
    DOMElement* child = XUtil::getFirstChildElement(root);

    for (; child != 0; child = XUtil::getNextSiblingElement(child)) {

        const XMLCh* name = child->getLocalName();

        if (XMLString::equals(name, SchemaSymbols::fgELT_ANNOTATION)) {
            continue;
        }
        else if (XMLString::equals(name, SchemaSymbols::fgELT_INCLUDE)) {
            preprocessInclude(child);
        }
        else if (XMLString::equals(name, SchemaSymbols::fgELT_IMPORT)) {
            preprocessImport(child);
        }
        else if (XMLString::equals(name, SchemaSymbols::fgELT_REDEFINE)) {
            preprocessRedefine(child);
        }
        else
            break;
    }
}